

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a70a8::BracedExpr::printLeft(BracedExpr *this,OutputStream *S)

{
  Node *this_00;
  StringView R;
  
  if (this->IsArray == true) {
    OutputStream::operator+=(S,'[');
    Node::print(this->Elem,S);
    OutputStream::operator+=(S,']');
  }
  else {
    OutputStream::operator+=(S,'.');
    Node::print(this->Elem,S);
  }
  this_00 = this->Init;
  if ((this_00->K & ~KDotSuffix) != KBracedExpr) {
    R.Last = "";
    R.First = " = ";
    OutputStream::operator+=(S,R);
    this_00 = this->Init;
  }
  Node::print(this_00,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsArray) {
      S += '[';
      Elem->print(S);
      S += ']';
    } else {
      S += '.';
      Elem->print(S);
    }
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }